

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrays.h
# Opt level: O3

void __thiscall
glslang::TSmallArrayVector::push_back(TSmallArrayVector *this,uint e,TIntermTyped *n)

{
  vector<glslang::TArraySize,glslang::pool_allocator<glslang::TArraySize>> *this_00;
  iterator __position;
  TArraySize pair;
  TArraySize local_28;
  
  alloc(this);
  this_00 = (vector<glslang::TArraySize,glslang::pool_allocator<glslang::TArraySize>> *)this->sizes;
  __position._M_current = *(TArraySize **)(this_00 + 0x10);
  if (__position._M_current == *(TArraySize **)(this_00 + 0x18)) {
    local_28.size = e;
    local_28.node = n;
    std::vector<glslang::TArraySize,glslang::pool_allocator<glslang::TArraySize>>::
    _M_realloc_insert<glslang::TArraySize_const&>(this_00,__position,&local_28);
  }
  else {
    *(ulong *)__position._M_current = CONCAT44(local_28._4_4_,e);
    (__position._M_current)->node = n;
    *(long *)(this_00 + 0x10) = *(long *)(this_00 + 0x10) + 0x10;
  }
  return;
}

Assistant:

void push_back(unsigned int e, TIntermTyped* n)
    {
        alloc();
        TArraySize pair = { e, n };
        sizes->push_back(pair);
    }